

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_capability.cpp
# Opt level: O0

bool spvtools::val::anon_unknown_3::IsSupportGuaranteedOpenCL_2_2
               (uint32_t capability,bool embedded_profile)

{
  bool bVar1;
  bool embedded_profile_local;
  uint32_t capability_local;
  
  bVar1 = IsSupportGuaranteedOpenCL_2_0(capability,embedded_profile);
  if (bVar1) {
    embedded_profile_local = true;
  }
  else if ((capability == 0x3a) || (capability == 0x3c)) {
    embedded_profile_local = true;
  }
  else {
    embedded_profile_local = false;
  }
  return embedded_profile_local;
}

Assistant:

bool IsSupportGuaranteedOpenCL_2_2(uint32_t capability, bool embedded_profile) {
  if (IsSupportGuaranteedOpenCL_2_0(capability, embedded_profile)) return true;

  switch (spv::Capability(capability)) {
    case spv::Capability::SubgroupDispatch:
    case spv::Capability::PipeStorage:
      return true;
    default:
      break;
  }
  return false;
}